

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

void __thiscall
iDynTree::AttitudeQuaternionEKF::serializeMeasurementVector(AttitudeQuaternionEKF *this)

{
  VectorDynSize *vec;
  double dVar1;
  size_t sVar2;
  double *pdVar3;
  LinearAccelerometerMeasurements *local_88 [2];
  PointerType local_78;
  Index IStack_70;
  undefined1 local_68;
  undefined1 local_60 [24];
  Index IStack_48;
  undefined1 local_40;
  variable_if_dynamic<long,__1> local_38;
  Index local_28;
  
  vec = &this->m_y;
  sVar2 = iDynTree::VectorDynSize::size();
  if (sVar2 != this->m_output_size) {
    iDynTree::VectorDynSize::resize((ulong)vec);
  }
  local_88[0] = &this->m_Acc_y;
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_78,vec);
  local_60._0_8_ = local_78;
  local_60._16_8_ = local_78;
  IStack_48 = IStack_70;
  local_40 = local_68;
  local_38.m_value = 0;
  local_28 = IStack_70;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)local_60,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_88);
  if ((this->m_params_qekf).use_magnetometer_measurements == true) {
    dVar1 = this->m_Mag_y;
    pdVar3 = (double *)iDynTree::VectorDynSize::operator()(vec,3);
    *pdVar3 = dVar1;
  }
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::serializeMeasurementVector()
{
    using iDynTree::toEigen;
    if (m_y.size() != m_output_size)
    {
        m_y.resize(m_output_size);
    }

    toEigen(m_y).block<3, 1>(0, 0) = toEigen(m_Acc_y);
    if (m_params_qekf.use_magnetometer_measurements)
    {
        m_y(3) = m_Mag_y;
    }
}